

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tree_base(nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
                nk_collapse_states initial_state,char *hash,int len,int line)

{
  nk_hash name;
  nk_uint *pnVar1;
  char *in_RCX;
  long in_RDI;
  nk_uint in_R8D;
  void *in_R9;
  nk_uint *state;
  nk_hash tree_hash;
  int title_len;
  nk_window *win;
  nk_collapse_states *in_stack_000000a8;
  char *in_stack_000000b0;
  nk_image *in_stack_000000b8;
  nk_tree_type in_stack_000000c4;
  nk_context *in_stack_000000c8;
  int iVar2;
  nk_context *ctx_00;
  
  ctx_00 = *(nk_context **)(in_RDI + 0x40d8);
  iVar2 = 0;
  if (in_R9 == (void *)0x0) {
    iVar2 = nk_strlen(in_RCX);
    name = nk_murmur_hash(in_RCX,iVar2,(nk_hash)win);
  }
  else {
    name = nk_murmur_hash(in_R9,tree_hash,(nk_hash)win);
  }
  pnVar1 = nk_find_value((nk_window *)ctx_00,name);
  if (pnVar1 == (nk_uint *)0x0) {
    pnVar1 = nk_add_value(ctx_00,(nk_window *)CONCAT44(iVar2,name),0,0);
    *pnVar1 = in_R8D;
  }
  iVar2 = nk_tree_state_base(in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,in_stack_000000b0
                             ,in_stack_000000a8);
  return iVar2;
}

Assistant:

NK_INTERN int
nk_tree_base(struct nk_context *ctx, enum nk_tree_type type,
struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
const char *hash, int len, int line)
{
struct nk_window *win = ctx->current;
int title_len = 0;
nk_hash tree_hash = 0;
nk_uint *state = 0;

/* retrieve tree state from internal widget state tables */
if (!hash) {
title_len = (int)nk_strlen(title);
tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
} else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
state = nk_find_value(win, tree_hash);
if (!state) {
state = nk_add_value(ctx, win, tree_hash, 0);
*state = initial_state;
}
return nk_tree_state_base(ctx, type, img, title, (enum nk_collapse_states*)state);
}